

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

bool Messages::Person_PhoneType_IsValid(int value)

{
  int value_local;
  
  return (uint)value < 3;
}

Assistant:

bool Person_PhoneType_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}